

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaAttDef.cpp
# Opt level: O0

void __thiscall xercesc_4_0::SchemaAttDef::serialize(SchemaAttDef *this,XSerializeEngine *serEng)

{
  bool bVar1;
  DatatypeValidator *pDVar2;
  PSVIScope local_1c;
  XSerializeEngine *pXStack_18;
  int i;
  XSerializeEngine *serEng_local;
  SchemaAttDef *this_local;
  
  pXStack_18 = serEng;
  serEng_local = (XSerializeEngine *)this;
  XMLAttDef::serialize(&this->super_XMLAttDef,serEng);
  bVar1 = XSerializeEngine::isStoring(pXStack_18);
  if (bVar1) {
    XSerializeEngine::writeSize(pXStack_18,this->fElemId);
    XSerializeEngine::operator<<(pXStack_18,this->fPSVIScope);
    operator<<(pXStack_18,&this->fAttName->super_XSerializable);
    DatatypeValidator::storeDV(pXStack_18,this->fDatatypeValidator);
    XTemplateSerializer::storeObject(this->fNamespaceList,pXStack_18);
    operator<<(pXStack_18,(XSerializable *)this->fBaseAttDecl);
  }
  else {
    XSerializeEngine::readSize(pXStack_18,&this->fElemId);
    XSerializeEngine::operator>>(pXStack_18,(int *)&local_1c);
    this->fPSVIScope = local_1c;
    xercesc_4_0::operator>>(pXStack_18,&this->fAttName);
    pDVar2 = DatatypeValidator::loadDV(pXStack_18);
    this->fDatatypeValidator = pDVar2;
    XTemplateSerializer::loadObject(&this->fNamespaceList,8,false,pXStack_18);
    xercesc_4_0::operator>>(pXStack_18,&this->fBaseAttDecl);
  }
  return;
}

Assistant:

void SchemaAttDef::serialize(XSerializeEngine& serEng)
{

    XMLAttDef::serialize(serEng);

    if (serEng.isStoring())
    {
        serEng.writeSize (fElemId);
        serEng<<(int)fPSVIScope;

        serEng<<fAttName;

        DatatypeValidator::storeDV(serEng, fDatatypeValidator);

        /***
         * Serialize ValueVectorOf<unsigned int>
         ***/
        XTemplateSerializer::storeObject(fNamespaceList, serEng);

        serEng<<fBaseAttDecl;
    }
    else
    {

        serEng.readSize (fElemId);
        int i;
        serEng>>i;
        fPSVIScope = (PSVIDefs::PSVIScope)i;

        serEng>>fAttName;

        fDatatypeValidator    = DatatypeValidator::loadDV(serEng);

        /***
         * Deserialize ValueVectorOf<unsigned int>
         ***/
        XTemplateSerializer::loadObject(&fNamespaceList, 8, false, serEng);

        serEng>>fBaseAttDecl;
    }
}